

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void __thiscall
btHashedOverlappingPairCache::processAllOverlappingPairs
          (btHashedOverlappingPairCache *this,btOverlapCallback *callback,btDispatcher *dispatcher)

{
  int iVar1;
  btBroadphasePair *pbVar2;
  ulong uVar3;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  btBroadphasePair *pair;
  int i;
  int local_1c;
  
  local_1c = 0;
  while (iVar1 = btAlignedObjectArray<btBroadphasePair>::size
                           ((btAlignedObjectArray<btBroadphasePair> *)(in_RDI + 1)),
        local_1c < iVar1) {
    pbVar2 = btAlignedObjectArray<btBroadphasePair>::operator[]
                       ((btAlignedObjectArray<btBroadphasePair> *)(in_RDI + 1),local_1c);
    uVar3 = (**(code **)(*in_RSI + 0x10))(in_RSI,pbVar2);
    if ((uVar3 & 1) == 0) {
      local_1c = local_1c + 1;
    }
    else {
      (**(code **)(*in_RDI + 0x18))(in_RDI,pbVar2->m_pProxy0,pbVar2->m_pProxy1,in_RDX);
      gOverlappingPairs = gOverlappingPairs + -1;
    }
  }
  return;
}

Assistant:

void	btHashedOverlappingPairCache::processAllOverlappingPairs(btOverlapCallback* callback,btDispatcher* dispatcher)
{

	int i;

//	printf("m_overlappingPairArray.size()=%d\n",m_overlappingPairArray.size());
	for (i=0;i<m_overlappingPairArray.size();)
	{
	
		btBroadphasePair* pair = &m_overlappingPairArray[i];
		if (callback->processOverlap(*pair))
		{
			removeOverlappingPair(pair->m_pProxy0,pair->m_pProxy1,dispatcher);

			gOverlappingPairs--;
		} else
		{
			i++;
		}
	}
}